

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_peak2_init(ma_peak2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                       ma_peak2 *pFilter)

{
  ma_result mVar1;
  void *pHeap;
  ulong uVar2;
  double __x;
  
  __x = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
  sin(__x);
  sin(1.5707963267948966 - __x);
  pow(10.0,pConfig->gainDB / 40.0);
  uVar2 = (ulong)pConfig->channels;
  if (uVar2 == 0) {
    mVar1 = (uint)(uVar2 != 0) * 2 + MA_INVALID_ARGS;
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(uVar2 << 3);
    }
    else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (void *)0x0;
    }
    else {
      pHeap = (*pAllocationCallbacks->onMalloc)(uVar2 << 3,pAllocationCallbacks->pUserData);
    }
    if (pHeap == (void *)0x0) {
      mVar1 = MA_OUT_OF_MEMORY;
    }
    else {
      mVar1 = ma_peak2_init_preallocated(pConfig,pHeap,pFilter);
      if (mVar1 == MA_SUCCESS) {
        (pFilter->bq)._ownsHeap = 1;
        mVar1 = MA_SUCCESS;
      }
      else {
        ma_free(pHeap,pAllocationCallbacks);
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_peak2_init(const ma_peak2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_peak2* pFilter)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_peak2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_peak2_init_preallocated(pConfig, pHeap, pFilter);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pFilter->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}